

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O3

int __thiscall HydEngine::open(HydEngine *this,char *__file,int __oflag,...)

{
  pointer pcVar1;
  MatrixSolver *pMVar2;
  HydSolver *pHVar3;
  SystemError *this_00;
  string local_60;
  string local_40;
  
  if (this->engineState != CLOSED) {
    close(this,(int)__file);
  }
  this->network = (Network *)__file;
  Network::createHeadLossModel((Network *)__file);
  Network::createDemandModel(this->network);
  Network::createLeakageModel(this->network);
  pcVar1 = (this->network->options).stringOptions[9]._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,
             pcVar1 + (this->network->options).stringOptions[9]._M_string_length);
  pMVar2 = MatrixSolver::factory(&local_60,(ostream *)&this->network->msgLog);
  this->matrixSolver = pMVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
    pMVar2 = this->matrixSolver;
  }
  if (pMVar2 == (MatrixSolver *)0x0) {
    this_00 = (SystemError *)__cxa_allocate_exception(0x30);
    SystemError::SystemError(this_00,6);
  }
  else {
    initMatrixSolver(this);
    pcVar1 = (this->network->options).stringOptions[7]._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,
               pcVar1 + (this->network->options).stringOptions[7]._M_string_length);
    pHVar3 = HydSolver::factory(&local_40,this->network,this->matrixSolver);
    this->hydSolver = pHVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
      pHVar3 = this->hydSolver;
    }
    if (pHVar3 != (HydSolver *)0x0) {
      this->engineState = OPENED;
      return (int)pHVar3;
    }
    this_00 = (SystemError *)__cxa_allocate_exception(0x30);
    SystemError::SystemError(this_00,7);
  }
  __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
}

Assistant:

void HydEngine::open(Network* nw)
{
    // ... close a currently opened engine

    if (engineState != HydEngine::CLOSED) close();
    network = nw;

    // ... create hydraulic sub-models (can throw exception)

    network->createHeadLossModel();
    network->createDemandModel();
    network->createLeakageModel();

    // ... create and initialize a matrix solver

    matrixSolver = MatrixSolver::factory(
        network->option(Options::MATRIX_SOLVER), network->msgLog);
    if ( matrixSolver == nullptr )
    {
        throw SystemError(SystemError::MATRIX_SOLVER_NOT_OPENED);
    }
    initMatrixSolver();

    // ... create a hydraulic solver

    hydSolver = HydSolver::factory(
        network->option(Options::HYD_SOLVER), network, matrixSolver);
    if ( hydSolver == nullptr )
    {
        throw SystemError(SystemError::HYDRAULIC_SOLVER_NOT_OPENED);
    }
    engineState = HydEngine::OPENED;
}